

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
FactoredDecPOMDPDiscrete::MarginalizeStateFactor
          (FactoredDecPOMDPDiscrete *this,Index sf,bool sparse)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  FactoredStateDistribution *fsd;
  vector<unsigned_long,_std::allocator<unsigned_long>_> old_factor_sizes;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> _Stack_38;
  
  __x = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
        (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                               super_MultiAgentDecisionProcess + 0xb8))();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_38,__x);
  fsd = (FactoredStateDistribution *)
        (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                               super_MultiAgentDecisionProcess + 0xd0))(this);
  ClipRewardModel(this,sf,sparse);
  MultiAgentDecisionProcessDiscreteFactoredStates::MarginalizeTransitionObservationModel
            (&this->super_MultiAgentDecisionProcessDiscreteFactoredStates,sf,sparse);
  MarginalizeISD(this,sf,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_38,fsd);
  if (fsd != (FactoredStateDistribution *)0x0) {
    (*(fsd->super_StateDistribution)._vptr_StateDistribution[1])(fsd);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&_Stack_38);
  return;
}

Assistant:

void FactoredDecPOMDPDiscrete::MarginalizeStateFactor(Index sf, bool sparse)
{
    vector<size_t> old_factor_sizes = GetNrValuesPerFactor();
    const FactoredStateDistribution* old_isd = GetFactoredISD();

    ClipRewardModel(sf, sparse);
    MarginalizeTransitionObservationModel(sf, sparse);
    MarginalizeISD(sf, old_factor_sizes, old_isd);

    delete(old_isd);
}